

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferVAOInputAttacher::drawContainer
          (BufferVAOInputAttacher *this,GLuint vao,Surface *dst)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  double __x;
  MessageBuilder local_1a0;
  Surface *local_20;
  Surface *dst_local;
  BufferVAOInputAttacher *pBStack_10;
  GLuint vao_local;
  BufferVAOInputAttacher *this_local;
  
  local_20 = dst;
  dst_local._4_4_ = vao;
  pBStack_10 = this;
  ScaleProgram::draw(this->m_program,vao,1.0,false,dst);
  deqp::gls::LifetimeTests::details::ContextWrapper::log
            (&(this->super_InputAttacher).super_ContextWrapper,__x);
  tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_1a0,(char (*) [34])"// Drew an output image with VAO ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)((long)&dst_local + 4));
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return;
}

Assistant:

void BufferVAOInputAttacher::drawContainer (GLuint vao, Surface& dst)
{
	m_program.draw(vao, 1.0, false, &dst);
	log() << TestLog::Message << "// Drew an output image with VAO " << vao
		  << TestLog::EndMessage;
}